

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvexHull.cpp
# Opt level: O1

HullError __thiscall
HACD::HullLibrary::CreateConvexHull(HullLibrary *this,HullDesc *desc,HullResult *result)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  HaF32 *vertices;
  HaF64 *vertexCloud;
  HaF32 *pHVar4;
  dgBigVector *pdVar5;
  HaU32 *pHVar6;
  HaF32 *pHVar7;
  HaU32 *pHVar8;
  uint uVar9;
  HullError HVar10;
  HullLibrary *this_00;
  HaU32 HVar11;
  long lVar12;
  HaF32 in_XMM0_Da;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 in_register_00001284 [12];
  HaU32 ovcount;
  size_t local_c8;
  HaU32 *local_c0;
  HaF32 *local_b8;
  size_t local_b0;
  HaF32 local_a8;
  HaF32 local_a4;
  HaF32 center [3];
  HaF32 scale [3];
  dgConvexHull3d convexHull;
  
  uVar9 = desc->mVcount;
  uVar3 = 8;
  if (8 < uVar9) {
    uVar3 = (ulong)uVar9;
  }
  vertices = (HaF32 *)malloc(uVar3 * 0xc);
  bVar1 = NormalizeAndCleanupVertices
                    ((HullLibrary *)center,uVar9,desc->mVertices,(uint)desc->mUseWuQuantizer,
                     &ovcount,vertices,in_XMM0_Da,scale,center,desc->mMaxVertices * 2,
                     desc->mUseWuQuantizer);
  HVar11 = ovcount;
  HVar10 = QE_FAIL;
  if (bVar1) {
    uVar3 = (ulong)ovcount;
    vertexCloud = (HaF64 *)malloc(uVar3 * 0x18);
    if (uVar3 != 0) {
      iVar2 = HVar11 * 3;
      uVar3 = 0;
      do {
        vertexCloud[uVar3] = (HaF64)(double)(float)vertices[uVar3];
        uVar3 = uVar3 + 1;
      } while (iVar2 + (uint)(iVar2 == 0) != uVar3);
    }
    dgConvexHull3d::dgConvexHull3d
              (&convexHull,vertexCloud,0x18,HVar11,9.999999747378752e-05,desc->mMaxVertices);
    HVar11 = convexHull.m_count;
    if (convexHull.super_dgList<dgConvexHull3DFace>.m_count == 0) {
      HVar10 = QE_FAIL;
    }
    else {
      lVar12 = (long)convexHull.m_count;
      pHVar4 = (HaF32 *)malloc(lVar12 * 0xc);
      if (lVar12 != 0) {
        local_b0 = CONCAT44(local_b0._4_4_,scale[0]);
        local_b8 = (HaF32 *)CONCAT44(local_b8._4_4_,scale[1]);
        local_c0 = (HaU32 *)CONCAT44(local_c0._4_4_,center[0]);
        local_c8 = CONCAT44(local_c8._4_4_,center[1]);
        local_a4 = scale[2];
        uVar9 = 0;
        local_a8 = center[2];
        pHVar7 = pHVar4;
        do {
          pdVar5 = dgArray<dgBigVector>::operator[](&convexHull.m_points,uVar9);
          auVar13._0_4_ = (float)(pdVar5->super_dgTemplateVector<double>).m_x;
          auVar13._4_12_ = in_register_00001284;
          auVar13 = vfmadd132ss_fma(auVar13,ZEXT416((uint)local_c0),ZEXT416((uint)local_b0));
          *pHVar7 = auVar13._0_4_;
          auVar14._0_4_ = (float)(pdVar5->super_dgTemplateVector<double>).m_y;
          auVar14._4_12_ = in_register_00001284;
          auVar13 = vfmadd132ss_fma(auVar14,ZEXT416((uint)local_c8),ZEXT416((uint)local_b8));
          pHVar7[1] = auVar13._0_4_;
          auVar15._0_4_ = (float)(pdVar5->super_dgTemplateVector<double>).m_z;
          auVar15._4_12_ = in_register_00001284;
          auVar13 = vfmadd132ss_fma(auVar15,ZEXT416((uint)local_a8),ZEXT416((uint)local_a4));
          pHVar7[2] = auVar13._0_4_;
          pHVar7 = pHVar7 + 3;
          uVar9 = uVar9 + 1;
          HVar11 = convexHull.m_count;
        } while (uVar9 < (uint)convexHull.m_count);
      }
      local_b0 = (ulong)(uint)convexHull.super_dgList<dgConvexHull3DFace>.m_count * 0xc;
      pHVar6 = (HaU32 *)malloc(local_b0);
      iVar2 = 0;
      pHVar8 = pHVar6;
      for (; convexHull.super_dgList<dgConvexHull3DFace>.m_first != (dgListNode *)0x0;
          convexHull.super_dgList<dgConvexHull3DFace>.m_first =
               (convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_next) {
        *pHVar8 = ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index[0];
        pHVar8[1] = ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index[1];
        pHVar8[2] = ((convexHull.super_dgList<dgConvexHull3DFace>.m_first)->m_info).m_index[2];
        iVar2 = iVar2 + 1;
        pHVar8 = pHVar8 + 3;
      }
      if (iVar2 != convexHull.super_dgList<dgConvexHull3DFace>.m_count) {
        __assert_fail("outCount == triangleCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/ConvexHull.cpp"
                      ,0x5e,
                      "HullError HACD::HullLibrary::CreateConvexHull(const HullDesc &, HullResult &)"
                     );
      }
      this_00 = (HullLibrary *)((long)(int)HVar11 * 0xc);
      local_b8 = (HaF32 *)malloc((size_t)this_00);
      BringOutYourDead(this_00,pHVar4,HVar11,local_b8,&ovcount,pHVar6,
                       convexHull.super_dgList<dgConvexHull3DFace>.m_count * 3);
      result->mNumOutputVertices = ovcount;
      local_c8 = (ulong)ovcount * 0xc;
      local_c0 = pHVar6;
      pHVar7 = (HaF32 *)malloc(local_c8);
      __n = local_b0;
      result->mOutputVertices = pHVar7;
      result->mNumTriangles = convexHull.super_dgList<dgConvexHull3DFace>.m_count;
      pHVar6 = (HaU32 *)malloc(local_b0);
      pHVar4 = local_b8;
      result->mIndices = pHVar6;
      memcpy(pHVar7,local_b8,local_c8);
      pHVar8 = local_c0;
      memcpy(pHVar6,local_c0,__n);
      free(pHVar8);
      free(pHVar4);
      HVar10 = QE_OK;
    }
    free(vertexCloud);
    dgConvexHull3d::~dgConvexHull3d(&convexHull);
  }
  free(vertices);
  return HVar10;
}

Assistant:

HullError HullLibrary::CreateConvexHull(const HullDesc       &desc,           // describes the input request
										HullResult           &result)         // contains the results
{
	HullError ret = QE_FAIL;

	hacd::HaU32 vcount = desc.mVcount;
	if ( vcount < 8 ) vcount = 8;

	hacd::HaF32 *vsource  = (hacd::HaF32 *) HACD_ALLOC( sizeof(hacd::HaF32)*vcount*3 );
	hacd::HaF32 scale[3];
	hacd::HaF32 center[3];

	hacd::HaU32 ovcount;
	bool ok = NormalizeAndCleanupVertices(desc.mVcount,desc.mVertices, desc.mVertexStride, ovcount, vsource, desc.mNormalEpsilon, scale, center, desc.mMaxVertices*2, desc.mUseWuQuantizer ); // normalize point cloud, remove duplicates!
	if ( ok )
	{
		HaF64 *bigVertices = (HaF64 *)HACD_ALLOC(sizeof(HaF64)*3*ovcount);
		for (HaU32 i=0; i<3*ovcount; i++)
		{
			bigVertices[i] = vsource[i];
		}

		dgConvexHull3d convexHull(bigVertices,sizeof(HaF64)*3,ovcount,0.0001f,desc.mMaxVertices);

		if ( convexHull.GetCount() )
		{
			HaF32 *hullVertices = (HaF32 *)HACD_ALLOC( sizeof(HaF32)*3*convexHull.GetVertexCount() );

			HaF32 *dest = hullVertices;
			for (HaU32 i=0; i<(HaU32)convexHull.GetVertexCount(); i++)
			{
				const dgBigVector &v = convexHull.GetVertex(i);
				dest[0] = (HaF32)v.m_x*scale[0]+center[0];
				dest[1] = (HaF32)v.m_y*scale[1]+center[1];
				dest[2] = (HaF32)v.m_z*scale[2]+center[2];
				dest+=3;
			}

			HaU32 triangleCount = convexHull.GetCount();
			HaU32 *indices = (HaU32*)HACD_ALLOC(triangleCount*sizeof(HaU32)*3);
			HaU32 *destIndices = indices;
			dgList<dgConvexHull3DFace>::Iterator iter(convexHull);
			HaU32 outCount = 0;
			for (iter.Begin(); iter; iter++)
			{
				dgConvexHull3DFace &face = (*iter);
				destIndices[0] = face.m_index[0];
				destIndices[1] = face.m_index[1];
				destIndices[2] = face.m_index[2];
				destIndices+=3;
				outCount++;
			}
			HACD_ASSERT( outCount == triangleCount );

			// re-index triangle mesh so it refers to only used vertices, rebuild a new vertex table.
			hacd::HaF32 *vscratch = (hacd::HaF32 *) HACD_ALLOC( sizeof(hacd::HaF32)*convexHull.GetVertexCount()*3 );
			BringOutYourDead(hullVertices,convexHull.GetVertexCount(),vscratch, ovcount, indices, triangleCount*3 );

			ret = QE_OK;

			result.mNumOutputVertices	= ovcount;
			result.mOutputVertices		= (hacd::HaF32 *)HACD_ALLOC( sizeof(hacd::HaF32)*ovcount*3);
			result.mNumTriangles		= triangleCount;
			result.mIndices           = (hacd::HaU32 *) HACD_ALLOC( sizeof(hacd::HaU32)*triangleCount*3);
			memcpy(result.mOutputVertices, vscratch, sizeof(hacd::HaF32)*3*ovcount );
			memcpy(result.mIndices, indices, sizeof(hacd::HaU32)*triangleCount*3);

			HACD_FREE(indices);
			HACD_FREE(vscratch);
		}

		HACD_FREE(bigVertices);
	}

	HACD_FREE(vsource);

	return ret;
}